

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

Enum xatlas::AddMesh(Atlas *atlas,MeshDecl *meshDecl,uint32_t meshCountHint)

{
  long lVar1;
  Task task_00;
  bool bVar2;
  bool bVar3;
  uint maxValue;
  uint32_t uVar4;
  TaskGroupHandle TVar5;
  Progress *pPVar6;
  Mesh *this;
  undefined8 *__s;
  float fVar7;
  Vector3 VVar8;
  uint32_t local_208;
  uint local_1ec;
  Task task;
  AddMeshTaskArgs *taskArgs;
  Vector3 local_1a0;
  Vector3 local_190;
  Vector3 local_180;
  Vector3 local_170;
  Vector3 local_160;
  Vector3 local_150;
  float local_144;
  Vector3 *pVStack_140;
  float area;
  Vector3 *c;
  Vector3 *b;
  Vector3 *a;
  Vector2 *uv;
  Vector3 *normal_1;
  Vector3 *pos;
  float fStack_108;
  int j_2;
  float local_100;
  Vector3 local_f4;
  Vector3 *local_e8;
  Vector3 *pos2;
  Vector3 *pos1;
  uint32_t local_d0;
  uint32_t index2;
  uint32_t index1;
  int j_1;
  uint32_t uStack_c0;
  bool ignore;
  int j;
  uint32_t tri [3];
  uint32_t i_2;
  float local_a8;
  Vector3 local_9c;
  Vector2 local_90;
  Vector3 local_88;
  Vector2 local_74;
  float local_6c;
  Vector2 local_68;
  Vector2 texcoord;
  Vector3 normal;
  uint32_t i_1;
  Mesh *mesh;
  uint32_t meshFlags;
  uint32_t index;
  uint32_t i;
  uint32_t indexCount;
  bool hasIndices;
  Atlas *pAStack_30;
  Context *ctx;
  MeshDecl *pMStack_20;
  uint32_t meshCountHint_local;
  MeshDecl *meshDecl_local;
  Atlas *atlas_local;
  
  ctx._4_4_ = meshCountHint;
  pMStack_20 = meshDecl;
  meshDecl_local = (MeshDecl *)atlas;
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x220b,"AddMeshError::Enum xatlas::AddMesh(Atlas *, const MeshDecl &, uint32_t)")
    ;
  }
  if (atlas == (Atlas *)0x0) {
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)("AddMesh: atlas is null.\n");
    }
    atlas_local._4_4_ = Error;
  }
  else {
    pAStack_30 = atlas;
    bVar2 = internal::Array<xatlas::internal::UvMesh_*>::isEmpty
                      ((Array<xatlas::internal::UvMesh_*> *)&atlas[4].atlasCount);
    if (bVar2) {
      lVar1._0_4_ = pAStack_30[1].atlasCount;
      lVar1._4_4_ = pAStack_30[1].chartCount;
      if (lVar1 == 0) {
        pPVar6 = (Progress *)
                 internal::Realloc((void *)0x0,0x50,0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                   ,0x221b);
        internal::Progress::Progress
                  (pPVar6,AddMesh,*(ProgressFunc *)&pAStack_30[3].texelsPerUnit,pAStack_30[3].image,
                   1);
        *(Progress **)&pAStack_30[1].atlasCount = pPVar6;
      }
      else {
        pPVar6 = *(Progress **)&pAStack_30[1].atlasCount;
        indexCount = pAStack_30[1].width + 1;
        maxValue = internal::max<unsigned_int>(&indexCount,(uint *)((long)&ctx + 4));
        internal::Progress::setMaxValue(pPVar6,maxValue);
      }
      bVar2 = pMStack_20->indexCount != 0;
      if (bVar2) {
        local_1ec = pMStack_20->indexCount;
      }
      else {
        local_1ec = pMStack_20->vertexCount;
      }
      if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0)) {
        (*(code *)internal::s_print)
                  ("Adding mesh %d: %u vertices, %u triangles\n",pAStack_30[1].width,
                   pMStack_20->vertexCount,(ulong)local_1ec / 3);
      }
      if (local_1ec % 3 == 0) {
        if (bVar2) {
          for (meshFlags = 0; meshFlags < local_1ec; meshFlags = meshFlags + 1) {
            uVar4 = DecodeIndex(pMStack_20->indexFormat,pMStack_20->indexData,
                                pMStack_20->indexOffset,meshFlags);
            if (pMStack_20->vertexCount <= uVar4) {
              return IndexOutOfRange;
            }
          }
        }
        mesh._0_4_ = 3;
        if (pMStack_20->vertexNormalData != (void *)0x0) {
          mesh._0_4_ = 7;
        }
        this = (Mesh *)internal::Realloc((void *)0x0,0x1c0,5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                         ,0x2232);
        internal::Mesh::Mesh
                  (this,pMStack_20->epsilon,pMStack_20->vertexCount,local_1ec / 3,(uint32_t)mesh,
                   pAStack_30[1].width);
        for (normal.y = 0.0; (uint)normal.y < pMStack_20->vertexCount;
            normal.y = (float)((int)normal.y + 1)) {
          internal::Vector3::Vector3((Vector3 *)&texcoord,0.0);
          internal::Vector2::Vector2(&local_68,0.0);
          if (pMStack_20->vertexNormalData != (void *)0x0) {
            VVar8 = DecodeNormal(pMStack_20,(uint32_t)normal.y);
            local_88._0_8_ = VVar8._0_8_;
            local_74.x = local_88.x;
            local_74.y = local_88.y;
            local_88.z = VVar8.z;
            local_6c = local_88.z;
            texcoord.x = local_88.x;
            texcoord.y = local_88.y;
            local_88 = VVar8;
          }
          if (pMStack_20->vertexUvData != (void *)0x0) {
            local_90 = DecodeUv(pMStack_20,(uint32_t)normal.y);
            local_68 = local_90;
          }
          VVar8 = DecodePosition(pMStack_20,(uint32_t)normal.y);
          stack0xffffffffffffff50 = VVar8._0_8_;
          local_9c.x = (float)tri[2];
          local_9c.y = (float)i_2;
          local_a8 = VVar8.z;
          local_9c.z = local_a8;
          unique0x1000099c = VVar8;
          internal::Mesh::addVertex(this,&local_9c,(Vector3 *)&texcoord,&local_68);
        }
        for (tri[1] = 0; tri[1] < local_1ec / 3; tri[1] = tri[1] + 1) {
          for (j_1 = 0; j_1 < 3; j_1 = j_1 + 1) {
            if (bVar2) {
              local_208 = DecodeIndex(pMStack_20->indexFormat,pMStack_20->indexData,
                                      pMStack_20->indexOffset,tri[1] * 3 + j_1);
            }
            else {
              local_208 = tri[1] * 3 + j_1;
            }
            *(uint32_t *)((long)&stack0xffffffffffffff40 + (long)j_1 * 4) = local_208;
          }
          index1._3_1_ = 0;
          for (index2 = 0; (int)index2 < 3; index2 = index2 + 1) {
            local_d0 = *(uint32_t *)((long)&stack0xffffffffffffff40 + (long)(int)index2 * 4);
            pos1._4_4_ = *(uint32_t *)
                          ((long)&stack0xffffffffffffff40 + (long)((int)(index2 + 1) % 3) * 4);
            if (local_d0 == pos1._4_4_) {
              index1._3_1_ = 1;
              if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0))
              {
                (*(code *)internal::s_print)
                          ("   Degenerate edge: index %d, index %d\n",local_d0,pos1._4_4_);
              }
              break;
            }
            pos2 = internal::Mesh::position(this,local_d0);
            local_e8 = internal::Mesh::position(this,pos1._4_4_);
            VVar8 = internal::operator-(local_e8,pos2);
            _fStack_108 = VVar8._0_8_;
            local_f4.x = fStack_108;
            local_f4.y = (float)j_2;
            local_100 = VVar8.z;
            local_f4.z = local_100;
            _fStack_108 = VVar8;
            fVar7 = internal::length(&local_f4);
            if (fVar7 <= 0.0) {
              index1._3_1_ = 1;
              if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0))
              {
                (*(code *)internal::s_print)
                          ((double)pos2->x,(double)pos2->y,(double)pos2->z,(double)local_e8->x,
                           (double)local_e8->y,(double)local_e8->z,
                           "   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n"
                           ,local_d0,pos1._4_4_);
              }
              break;
            }
          }
          if ((index1._3_1_ & 1) == 0) {
            for (pos._4_4_ = 0; pos._4_4_ < 3; pos._4_4_ = pos._4_4_ + 1) {
              normal_1 = internal::Mesh::position
                                   (this,*(uint32_t *)
                                          ((long)&stack0xffffffffffffff40 + (long)pos._4_4_ * 4));
              bVar3 = internal::isNan(normal_1->x);
              if (((bVar3) || (bVar3 = internal::isNan(normal_1->y), bVar3)) ||
                 (bVar3 = internal::isNan(normal_1->z), bVar3)) {
                if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0)
                   ) {
                  (*(code *)internal::s_print)("   NAN position in face: %d\n",tri[1]);
                }
                index1._3_1_ = 1;
                break;
              }
              if (pMStack_20->vertexNormalData != (void *)0x0) {
                uv = (Vector2 *)
                     internal::Mesh::normal
                               (this,*(uint32_t *)
                                      ((long)&stack0xffffffffffffff40 + (long)pos._4_4_ * 4));
                bVar3 = internal::isNan(((Vector3 *)uv)->x);
                if (((bVar3) || (bVar3 = internal::isNan(uv->y), bVar3)) ||
                   (bVar3 = internal::isNan(uv[1].x), bVar3)) {
                  if ((internal::s_print != (undefined *)0x0) &&
                     ((internal::s_printVerbose & 1) != 0)) {
                    (*(code *)internal::s_print)("   NAN normal in face: %d\n",tri[1]);
                  }
                  index1._3_1_ = 1;
                  break;
                }
              }
              if (pMStack_20->vertexUvData != (void *)0x0) {
                a = (Vector3 *)
                    internal::Mesh::texcoord
                              (this,*(uint32_t *)
                                     ((long)&stack0xffffffffffffff40 + (long)pos._4_4_ * 4));
                bVar3 = internal::isNan(a->x);
                if ((bVar3) || (bVar3 = internal::isNan(a->y), bVar3)) {
                  if ((internal::s_print != (undefined *)0x0) &&
                     ((internal::s_printVerbose & 1) != 0)) {
                    (*(code *)internal::s_print)("   NAN texture coordinate in face: %d\n",tri[1]);
                  }
                  index1._3_1_ = 1;
                  break;
                }
              }
            }
          }
          b = internal::Mesh::position(this,uStack_c0);
          c = internal::Mesh::position(this,j);
          pVStack_140 = internal::Mesh::position(this,tri[0]);
          local_144 = 0.0;
          if ((index1._3_1_ & 1) == 0) {
            VVar8 = internal::operator-(c,b);
            local_170.z = VVar8.z;
            local_160.z = local_170.z;
            local_170._0_8_ = VVar8._0_8_;
            local_160.x = local_170.x;
            local_160.y = local_170.y;
            local_170 = VVar8;
            VVar8 = internal::operator-(pVStack_140,b);
            local_190.z = VVar8.z;
            local_180.z = local_190.z;
            local_190._0_8_ = VVar8._0_8_;
            local_180.x = local_190.x;
            local_180.y = local_190.y;
            VVar8 = internal::cross(&local_160,&local_180);
            local_1a0._0_8_ = VVar8._0_8_;
            local_150.x = local_1a0.x;
            local_150.y = local_1a0.y;
            local_1a0.z = VVar8.z;
            local_150.z = local_1a0.z;
            local_144 = internal::length(&local_150);
            local_144 = local_144 * 0.5;
            if (((local_144 <= 1.1920929e-07) &&
                (index1._3_1_ = 1, internal::s_print != (undefined *)0x0)) &&
               ((internal::s_printVerbose & 1) != 0)) {
              (*(code *)internal::s_print)
                        ((double)local_144,"   Zero area face: %d, indices (%d %d %d), area is %f\n"
                         ,tri[1],uStack_c0,j,tri[0]);
            }
          }
          if (((index1._3_1_ & 1) == 0) &&
             ((((bVar3 = internal::equal(b,c,pMStack_20->epsilon), bVar3 ||
                (bVar3 = internal::equal(b,pVStack_140,pMStack_20->epsilon), bVar3)) ||
               (bVar3 = internal::equal(c,pVStack_140,pMStack_20->epsilon), bVar3)) &&
              ((index1._3_1_ = 1, internal::s_print != (undefined *)0x0 &&
               ((internal::s_printVerbose & 1) != 0)))))) {
            (*(code *)internal::s_print)
                      ((double)local_144,"   Degenerate face: %d, area is %f\n",tri[1]);
          }
          if ((pMStack_20->faceIgnoreData != (bool *)0x0) &&
             ((pMStack_20->faceIgnoreData[tri[1]] & 1U) != 0)) {
            index1._3_1_ = 1;
          }
          internal::Mesh::addFace(this,uStack_c0,j,tri[0],(bool)(index1._3_1_ & 1),true);
        }
        if (pAStack_30[1].meshCount == 0xffffffff) {
          TVar5 = internal::TaskScheduler::createTaskGroup(*(TaskScheduler **)(pAStack_30 + 4),0);
          pAStack_30[1].meshCount = TVar5.value;
        }
        __s = (undefined8 *)
              internal::Realloc((void *)0x0,0x10,0,
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                ,0x2286);
        memset(__s,0,0x10);
        *__s = pAStack_30;
        __s[1] = this;
        task_00.userData = __s;
        task_00.func = runAddMeshTask;
        internal::TaskScheduler::run
                  (*(TaskScheduler **)(pAStack_30 + 4),(TaskGroupHandle)pAStack_30[1].meshCount,
                   task_00);
        pAStack_30[1].width = pAStack_30[1].width + 1;
        atlas_local._4_4_ = Success;
      }
      else {
        atlas_local._4_4_ = InvalidIndexCount;
      }
    }
    else {
      if (internal::s_print != (undefined *)0x0) {
        (*(code *)internal::s_print)
                  ("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
      }
      atlas_local._4_4_ = Error;
    }
  }
  return atlas_local._4_4_;
}

Assistant:

AddMeshError::Enum AddMesh(Atlas *atlas, const MeshDecl &meshDecl, uint32_t meshCountHint)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->uvMeshes.isEmpty()) {
		XA_PRINT_WARNING("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->meshCount == 0)
		internal::s_profile.addMeshReal = clock();
#endif
	// Don't know how many times AddMesh will be called, so progress needs to adjusted each time.
	if (!ctx->addMeshProgress) {
		ctx->addMeshProgress = XA_NEW_ARGS(internal::MemTag::Default, internal::Progress, ProgressCategory::AddMesh, ctx->progressFunc, ctx->progressUserData, 1);
	}
	else {
		ctx->addMeshProgress->setMaxValue(internal::max(ctx->meshCount + 1, meshCountHint));
	}
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = meshDecl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? meshDecl.indexCount : meshDecl.vertexCount;
	XA_PRINT("Adding mesh %d: %u vertices, %u triangles\n", ctx->meshCount, meshDecl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i);
			if (index >= meshDecl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	uint32_t meshFlags = internal::MeshFlags::HasFaceGroups | internal::MeshFlags::HasIgnoredFaces;
	if (meshDecl.vertexNormalData)
		meshFlags |= internal::MeshFlags::HasNormals;
	internal::Mesh *mesh = XA_NEW_ARGS(internal::MemTag::Mesh, internal::Mesh, meshDecl.epsilon, meshDecl.vertexCount, indexCount / 3, meshFlags, ctx->meshCount);
	for (uint32_t i = 0; i < meshDecl.vertexCount; i++) {
		internal::Vector3 normal(0.0f);
		internal::Vector2 texcoord(0.0f);
		if (meshDecl.vertexNormalData)
			normal = DecodeNormal(meshDecl, i);
		if (meshDecl.vertexUvData)
			texcoord = DecodeUv(meshDecl, i);
		mesh->addVertex(DecodePosition(meshDecl, i), normal, texcoord);
	}
	for (uint32_t i = 0; i < indexCount / 3; i++) {
		uint32_t tri[3];
		for (int j = 0; j < 3; j++)
			tri[j] = hasIndices ? DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i * 3 + j) : i * 3 + j;
		bool ignore = false;
		// Check for degenerate or zero length edges.
		for (int j = 0; j < 3; j++) {
			const uint32_t index1 = tri[j];
			const uint32_t index2 = tri[(j + 1) % 3];
			if (index1 == index2) {
				ignore = true;
				XA_PRINT("   Degenerate edge: index %d, index %d\n", index1, index2);
				break;
			}
			const internal::Vector3 &pos1 = mesh->position(index1);
			const internal::Vector3 &pos2 = mesh->position(index2);
			if (internal::length(pos2 - pos1) <= 0.0f) {
				ignore = true;
				XA_PRINT("   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n", index1, pos1.x, pos1.y, pos1.z, index2, pos2.x, pos2.y, pos2.z);
				break;
			}
		}
		// Ignore faces with any nan vertex attributes.
		if (!ignore) {
			for (int j = 0; j < 3; j++) {
				const internal::Vector3 &pos = mesh->position(tri[j]);
				if (internal::isNan(pos.x) || internal::isNan(pos.y) || internal::isNan(pos.z)) {
					XA_PRINT("   NAN position in face: %d\n", i);
					ignore = true;
					break;
				}
				if (meshDecl.vertexNormalData) {
					const internal::Vector3 &normal = mesh->normal(tri[j]);
					if (internal::isNan(normal.x) || internal::isNan(normal.y) || internal::isNan(normal.z)) {
						XA_PRINT("   NAN normal in face: %d\n", i);
						ignore = true;
						break;
					}
				}
				if (meshDecl.vertexUvData) {
					const internal::Vector2 &uv = mesh->texcoord(tri[j]);
					if (internal::isNan(uv.x) || internal::isNan(uv.y)) {
						XA_PRINT("   NAN texture coordinate in face: %d\n", i);
						ignore = true;
						break;
					}
				}
			}
		}
		const internal::Vector3 &a = mesh->position(tri[0]);
		const internal::Vector3 &b = mesh->position(tri[1]);
		const internal::Vector3 &c = mesh->position(tri[2]);
		// Check for zero area faces.
		float area = 0.0f;
		if (!ignore) {
			area = internal::length(internal::cross(b - a, c - a)) * 0.5f;
			if (area <= internal::kAreaEpsilon) {
				ignore = true;
				XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", i, tri[0], tri[1], tri[2], area);
			}
		}
		if (!ignore) {
			if (internal::equal(a, b, meshDecl.epsilon) || internal::equal(a, c, meshDecl.epsilon) || internal::equal(b, c, meshDecl.epsilon)) {
				ignore = true;
				XA_PRINT("   Degenerate face: %d, area is %f\n", i, area);
			}
		}
		if (meshDecl.faceIgnoreData && meshDecl.faceIgnoreData[i])
			ignore = true;
		mesh->addFace(tri[0], tri[1], tri[2], ignore);
	}
	XA_PROFILE_END(addMeshCopyData)
	if (ctx->addMeshTaskGroup.value == UINT32_MAX)
		ctx->addMeshTaskGroup = ctx->taskScheduler->createTaskGroup();
	AddMeshTaskArgs *taskArgs = XA_NEW(internal::MemTag::Default, AddMeshTaskArgs); // The task frees this.
	taskArgs->ctx = ctx;
	taskArgs->mesh = mesh;
	internal::Task task;
	task.userData = taskArgs;
	task.func = runAddMeshTask;
	ctx->taskScheduler->run(ctx->addMeshTaskGroup, task);
	ctx->meshCount++;
	return AddMeshError::Success;
}